

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

int wally_scriptpubkey_get_type(uchar *bytes,size_t bytes_len,size_t *written)

{
  uchar uVar1;
  int iVar2;
  undefined8 unaff_RBP;
  undefined8 uVar3;
  ulong uVar4;
  ulong bytes_len_00;
  uchar *bytes_00;
  bool bVar5;
  size_t sStack_50;
  size_t local_48;
  size_t n_op;
  undefined8 local_38;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((bytes_len == 0 || bytes == (uchar *)0x0) || written == (size_t *)0x0) {
    return -2;
  }
  uVar1 = *bytes;
  uVar3 = CONCAT71((int7)((ulong)unaff_RBP >> 8),uVar1);
  if (uVar1 == 'j') {
    iVar2 = get_push_size(bytes + 1,bytes_len - 1,true,&n_op);
    if (((iVar2 == 0) &&
        (iVar2 = get_push_size(bytes + 1,bytes_len - 1,false,&local_48), iVar2 == 0)) &&
       (n_op + local_48 + 1 == bytes_len)) {
      sStack_50 = 1;
      goto LAB_00102fb0;
    }
  }
  local_38 = uVar3;
  if ((((byte)(uVar1 + 0xaf) < 0x10 && 0x24 < bytes_len) && (bytes[bytes_len - 1] == 0xae)) &&
     ((byte)(bytes[bytes_len - 2] + 0xaf) < 0x10)) {
    uVar4 = (ulong)(bytes[bytes_len - 2] - 0x50);
    bytes_00 = bytes + 1;
    bytes_len_00 = bytes_len - 1;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      iVar2 = get_push_size(bytes_00,bytes_len_00,true,&n_op);
      if (((iVar2 != 0) ||
          (iVar2 = get_push_size(bytes_00,bytes_len_00,false,&local_48), iVar2 != 0)) ||
         (((local_48 != 0x41 && (local_48 != 0x21)) || (bytes_len_00 < n_op + local_48 + 2))))
      goto LAB_00102efe;
      bytes_00 = bytes_00 + n_op + local_48;
      bytes_len_00 = bytes_len_00 - (n_op + local_48);
    }
    if (bytes_len_00 == 2) {
      sStack_50 = 0x20;
      goto LAB_00102fb0;
    }
  }
LAB_00102efe:
  if (bytes_len == 0x16) {
    if ((char)local_38 != '\0') {
      return 0;
    }
    if (bytes[1] != '\x14') {
      return 0;
    }
    sStack_50 = 8;
  }
  else if (bytes_len == 0x17) {
    if ((char)local_38 != -0x57) {
      return 0;
    }
    if (bytes[1] != '\x14') {
      return 0;
    }
    if (bytes[0x16] != 0x87) {
      return 0;
    }
    sStack_50 = 4;
  }
  else if (bytes_len == 0x22) {
    if ((char)local_38 != '\0') {
      return 0;
    }
    if (bytes[1] != ' ') {
      return 0;
    }
    sStack_50 = 0x10;
  }
  else {
    if (bytes_len != 0x19) {
      return 0;
    }
    if ((char)local_38 != 'v') {
      return 0;
    }
    if (bytes[1] != 0xa9) {
      return 0;
    }
    if (bytes[2] != '\x14') {
      return 0;
    }
    if (bytes[0x17] != 0x88) {
      return 0;
    }
    if (bytes[0x18] != 0xac) {
      return 0;
    }
    sStack_50 = 2;
  }
LAB_00102fb0:
  *written = sStack_50;
  return 0;
}

Assistant:

int wally_scriptpubkey_get_type(const unsigned char *bytes, size_t bytes_len,
                                size_t *written)
{
    if (written)
        *written = WALLY_SCRIPT_TYPE_UNKNOWN;

    if (!bytes || !bytes_len || !written)
        return WALLY_EINVAL;

    if (scriptpubkey_is_op_return(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_OP_RETURN;
        return WALLY_OK;
    }

    if (scriptpubkey_is_multisig(bytes, bytes_len)) {
        *written = WALLY_SCRIPT_TYPE_MULTISIG;
        return WALLY_OK;
    }

    switch (bytes_len) {
    case WALLY_SCRIPTPUBKEY_P2PKH_LEN:
        if (scriptpubkey_is_p2pkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2PKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2SH_LEN:
        if (scriptpubkey_is_p2sh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2SH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WPKH_LEN:
        if (scriptpubkey_is_p2wpkh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WPKH;
            return WALLY_OK;
        }
        break;
    case WALLY_SCRIPTPUBKEY_P2WSH_LEN:
        if (scriptpubkey_is_p2wsh(bytes, bytes_len)) {
            *written = WALLY_SCRIPT_TYPE_P2WSH;
            return WALLY_OK;
        }
        break;
    }
    return WALLY_OK;
}